

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench.cc
# Opt level: O3

void time_map_fetch<EasyUseMap<HashObject<4,4>,int>>
               (int iters,vector<int,_std::allocator<int>_> *indices,char *title)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_color _Var2;
  _Base_ptr p_Var3;
  mapped_type *pmVar4;
  long lVar5;
  long lVar6;
  _Base_ptr in_RCX;
  size_t start_memory;
  int iVar7;
  uint __seed;
  ulong uVar8;
  _Base_ptr p_Var9;
  _Base_ptr p_Var10;
  _Base_ptr p_Var11;
  _Base_ptr p_Var12;
  EasyUseMap<HashObject<4,_4>,_int> set;
  key_type local_64;
  _Rb_tree<HashObject<4,_4>,_std::pair<const_HashObject<4,_4>,_int>,_std::_Select1st<std::pair<const_HashObject<4,_4>,_int>_>,_std::less<HashObject<4,_4>_>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>_>
  local_60;
  
  p_Var1 = &local_60._M_impl.super__Rb_tree_header;
  iVar7 = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  g_num_copies = 0;
  g_num_hashes = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  std::chrono::_V2::steady_clock::now();
  if (iters < 1) {
    g_num_copies = 0;
    g_num_hashes = 0;
    __seed = 1;
    lVar5 = std::chrono::_V2::steady_clock::now();
  }
  else {
    do {
      local_64.i_ = iVar7;
      pmVar4 = std::
               map<HashObject<4,_4>,_int,_std::less<HashObject<4,_4>_>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>_>
               ::operator[]((map<HashObject<4,_4>,_int,_std::less<HashObject<4,_4>_>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>_>
                             *)&local_60,&local_64);
      iVar7 = iVar7 + 1;
      *pmVar4 = iVar7;
    } while (iters != iVar7);
    g_num_copies = 0;
    g_num_hashes = 0;
    lVar5 = std::chrono::_V2::steady_clock::now();
    if (iters < 1) {
      __seed = 1;
    }
    else {
      __seed = 1;
      uVar8 = 0;
      do {
        p_Var12 = &p_Var1->_M_header;
        if (local_60._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
          iVar7 = (indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_start[uVar8];
          p_Var11 = &p_Var1->_M_header;
          p_Var3 = local_60._M_impl.super__Rb_tree_header._M_header._M_parent;
          do {
            p_Var9 = p_Var3;
            p_Var10 = p_Var11;
            _Var2 = p_Var9[1]._M_color;
            p_Var11 = p_Var9;
            if ((int)_Var2 < iVar7) {
              p_Var11 = p_Var10;
            }
            p_Var3 = (&p_Var9->_M_left)[(int)_Var2 < iVar7];
          } while ((&p_Var9->_M_left)[(int)_Var2 < iVar7] != (_Base_ptr)0x0);
          if ((_Rb_tree_header *)p_Var11 != p_Var1) {
            if ((int)_Var2 < iVar7) {
              p_Var9 = p_Var10;
            }
            p_Var12 = p_Var11;
            if (iVar7 < (int)p_Var9[1]._M_color) {
              p_Var12 = &p_Var1->_M_header;
            }
          }
        }
        __seed = __seed ^ (_Rb_tree_header *)p_Var12 != p_Var1;
        uVar8 = uVar8 + 1;
        in_RCX = local_60._M_impl.super__Rb_tree_header._M_header._M_parent;
      } while (uVar8 != (uint)iters);
    }
  }
  lVar6 = std::chrono::_V2::steady_clock::now();
  srand(__seed);
  report(title,(double)(lVar6 - lVar5),iters,start_memory,(size_t)in_RCX);
  std::
  _Rb_tree<HashObject<4,_4>,_std::pair<const_HashObject<4,_4>,_int>,_std::_Select1st<std::pair<const_HashObject<4,_4>,_int>_>,_std::less<HashObject<4,_4>_>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>_>
  ::~_Rb_tree(&local_60);
  return;
}

Assistant:

static void time_map_fetch(int iters, const vector<int>& indices,
                           char const* title) {
  MapType set;
  Rusage t;
  int r;
  int i;

  for (i = 0; i < iters; i++) {
    set[i] = i + 1;
  }

  r = 1;
  t.Reset();
  for (i = 0; i < iters; i++) {
    r ^= static_cast<int>(set.find(indices[i]) != set.end());
  }
  double ut = t.UserTime();

  srand(r);  // keep compiler from optimizing away r (we never call rand())
  report(title, ut, iters, 0, 0);
}